

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_BlitRectX(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,GPU_Rect *dest_rect,
                  float degrees,float pivot_x,float pivot_y,GPU_FlipEnum flip_direction)

{
  float fVar1;
  float fVar2;
  float scaleX;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (target == (GPU_Target *)0x0 || image == (GPU_Image *)0x0) {
    return;
  }
  if (src_rect == (GPU_Rect *)0x0) {
    fVar3 = (float)image->w;
    fVar1 = (float)image->h;
  }
  else {
    fVar3 = src_rect->w;
    fVar1 = src_rect->h;
  }
  if (dest_rect == (GPU_Rect *)0x0) {
    fVar6 = (float)target->w;
    fVar5 = (float)target->h;
    fVar2 = 0.0;
    fVar4 = 0.0;
  }
  else {
    fVar2 = dest_rect->x;
    fVar4 = dest_rect->y;
    fVar6 = dest_rect->w;
    fVar5 = dest_rect->h;
  }
  scaleX = fVar6 / fVar3;
  if ((flip_direction & 1) != 0) {
    scaleX = -scaleX;
    fVar2 = fVar2 + fVar6;
    pivot_x = fVar3 - pivot_x;
  }
  fVar3 = fVar5 / fVar1;
  if ((flip_direction & 2) != 0) {
    fVar3 = -fVar3;
    fVar4 = fVar4 + fVar5;
    pivot_y = fVar1 - pivot_y;
  }
  GPU_BlitTransformX(image,src_rect,target,pivot_x * scaleX + fVar2,pivot_y * fVar3 + fVar4,pivot_x,
                     pivot_y,degrees,scaleX,fVar3);
  return;
}

Assistant:

void GPU_BlitRectX(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, GPU_Rect* dest_rect, float degrees, float pivot_x, float pivot_y, GPU_FlipEnum flip_direction)
{
    float w, h;
    float dx, dy;
    float dw, dh;
    float scale_x, scale_y;
    
    if(image == NULL || target == NULL)
        return;
    
    if(src_rect == NULL)
    {
        w = image->w;
        h = image->h;
    }
    else
    {
        w = src_rect->w;
        h = src_rect->h;
    }
    
    if(dest_rect == NULL)
    {
        dx = 0.0f;
        dy = 0.0f;
        dw = target->w;
        dh = target->h;
    }
    else
    {
        dx = dest_rect->x;
        dy = dest_rect->y;
        dw = dest_rect->w;
        dh = dest_rect->h;
    }
    
    scale_x = dw / w;
    scale_y = dh / h;
    
    if(flip_direction & GPU_FLIP_HORIZONTAL)
    {
        scale_x = -scale_x;
        dx += dw;
        pivot_x = w - pivot_x;
    }
    if(flip_direction & GPU_FLIP_VERTICAL)
    {
        scale_y = -scale_y;
        dy += dh;
        pivot_y = h - pivot_y;
    }
    
    GPU_BlitTransformX(image, src_rect, target, dx + pivot_x * scale_x, dy + pivot_y * scale_y, pivot_x, pivot_y, degrees, scale_x, scale_y);
}